

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O0

void runWithXdgActivationToken<QDesktopUnixServices::openDocument(QUrl_const&)::__0>
               (anon_class_16_2_6708b258_for_o *functionToCall)

{
  long lVar1;
  undefined4 uVar2;
  QWindow *sender;
  QPlatformNativeInterface *pQVar3;
  QPlatformWindow *pQVar4;
  long in_FS_OFFSET;
  QWaylandWindow *waylandWindow;
  QWaylandApplication *waylandApp;
  QWindow *window;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  QWindow *in_stack_ffffffffffffff50;
  anon_class_16_2_6708b258_for_o *local_98;
  ContextType *local_88;
  Connection local_40 [16];
  offset_in_QWaylandWindow_to_subr in_stack_ffffffffffffffd0;
  ConnectionType in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QCoreApplication::instance();
  sender = QGuiApplication::focusWindow();
  if (sender == (QWindow *)0x0) {
    QString::QString((QString *)0xac8c0b);
    QtPrivate::detail::
    StorageByValue<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/platform/unix/qdesktopunixservices.cpp:541:35),_void>
    ::anon_class_16_2_6708b258_for_o::operator()
              ((anon_class_16_2_6708b258_for_o *)in_stack_ffffffffffffff50,
               (QString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QString::~QString((QString *)0xac8c2a);
  }
  else {
    QCoreApplication::instance();
    pQVar3 = QGuiApplication::platformNativeInterface();
    if (pQVar3 == (QPlatformNativeInterface *)0x0) {
      local_88 = (ContextType *)0x0;
    }
    else {
      local_88 = (ContextType *)
                 __dynamic_cast(pQVar3,&QPlatformNativeInterface::typeinfo,
                                &QNativeInterface::QWaylandApplication::typeinfo,0xfffffffffffffffe)
      ;
    }
    pQVar4 = QWindow::handle(in_stack_ffffffffffffff50);
    if (pQVar4 == (QPlatformWindow *)0x0) {
      local_98 = (anon_class_16_2_6708b258_for_o *)0x0;
    }
    else {
      local_98 = (anon_class_16_2_6708b258_for_o *)
                 __dynamic_cast(pQVar4,&QPlatformWindow::typeinfo,
                                &QNativeInterface::Private::QWaylandWindow::typeinfo,
                                0xfffffffffffffffe);
    }
    if ((local_98 == (anon_class_16_2_6708b258_for_o *)0x0) || (local_88 == (ContextType *)0x0)) {
      QString::QString((QString *)0xac8cf2);
      QtPrivate::detail::
      StorageByValue<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/platform/unix/qdesktopunixservices.cpp:541:35),_void>
      ::anon_class_16_2_6708b258_for_o::operator()
                ((anon_class_16_2_6708b258_for_o *)in_stack_ffffffffffffff50,
                 (QString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      QString::~QString((QString *)0xac8d11);
    }
    else {
      QObject::
      connect<void(QNativeInterface::Private::QWaylandWindow::*)(QString_const&),QDesktopUnixServices::openDocument(QUrl_const&)::__0&>
                ((Object *)sender,in_stack_ffffffffffffffd0,local_88,local_98,
                 in_stack_fffffffffffffff0);
      QMetaObject::Connection::~Connection(local_40);
      uVar2 = (**(code **)(*(long *)local_88 + 0x40))();
      (*(code *)(local_98->openDocumentInternal).this[1].m_documentLauncher.d.d)(local_98,uVar2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void runWithXdgActivationToken(F &&functionToCall)
{
#if QT_CONFIG(wayland)
    QWindow *window = qGuiApp->focusWindow();

    if (!window) {
        functionToCall({});
        return;
    }

    auto waylandApp = dynamic_cast<QNativeInterface::QWaylandApplication *>(
            qGuiApp->platformNativeInterface());
    auto waylandWindow =
            dynamic_cast<QNativeInterface::Private::QWaylandWindow *>(window->handle());

    if (!waylandWindow || !waylandApp) {
        functionToCall({});
        return;
    }

    QObject::connect(waylandWindow,
                     &QNativeInterface::Private::QWaylandWindow::xdgActivationTokenCreated,
                     waylandWindow, functionToCall, Qt::SingleShotConnection);
    waylandWindow->requestXdgActivationToken(waylandApp->lastInputSerial());
#else
    functionToCall({});
#endif
}